

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib509.c
# Opt level: O0

char * custom_strdup(char *ptr)

{
  char *pcVar1;
  char *ptr_local;
  
  if ((seen_strdup == 0) && (seen_malloc != 0)) {
    seen_strdup = 1;
  }
  pcVar1 = strdup(ptr);
  return pcVar1;
}

Assistant:

char *custom_strdup(const char *ptr)
{
  if(!seen_strdup && seen_malloc) {
    /* currently (2013.03.13), memory tracking enabled builds do not call
       the strdup callback, in this case malloc callback and memcpy are used
       instead. If some day this is changed the following printf() should be
       uncommented, and a line added to test definition.
    printf("seen custom_strdup()\n");
    */
    seen_strdup = 1;
  }
  return (strdup)(ptr);
}